

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_modes(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,int tile_row,
                int tile_col)

{
  TokenList *(*papTVar1) [64];
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  SequenceHeader *pSVar6;
  ENTROPY_CONTEXT *pEVar7;
  byte bVar8;
  byte bVar9;
  MACROBLOCK *pMVar10;
  MACROBLOCK *pMVar11;
  MACROBLOCKD *pMVar12;
  ENTROPY_CONTEXT (*paEVar13) [32];
  uint num_planes;
  CB_COEFF_BUFFER *pCVar14;
  size_t __n;
  int iVar15;
  ulong uVar16;
  int mi_row;
  uint mi_row_00;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  TokenExtra *local_38;
  
  iVar3 = tile->mi_col_start;
  iVar4 = tile->mi_col_end;
  pSVar6 = (cpi->common).seq_params;
  uVar18 = -1L << ((byte)pSVar6->mib_size_log2 & 0x3f);
  bVar9 = (byte)pSVar6->subsampling_x;
  uVar18 = (long)(int)(~(uint)uVar18 + (iVar4 - iVar3)) & uVar18;
  bVar8 = bVar9 & 0x1f;
  iVar17 = iVar3 >> bVar8;
  bVar9 = bVar9 & 0x1f;
  uVar2 = pSVar6->monochrome;
  iVar15 = tile->tile_row;
  mi_row_00 = tile->mi_row_start;
  iVar5 = tile->mi_row_end;
  memset((cpi->common).above_contexts.entropy[0][iVar15] + iVar3,0 >> bVar8,uVar18);
  bVar19 = uVar2 == '\0';
  num_planes = bVar19 + 1 + (uint)bVar19;
  if (bVar19) {
    pEVar7 = (cpi->common).above_contexts.entropy[1][iVar15];
    if ((pEVar7 == (ENTROPY_CONTEXT *)0x0) ||
       ((cpi->common).above_contexts.entropy[2][iVar15] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid value of planes"
                        );
    }
    else {
      __n = (size_t)((int)uVar18 >> bVar9);
      memset(pEVar7 + iVar17,0 >> bVar9,__n);
      memset((cpi->common).above_contexts.entropy[2][iVar15] + iVar17,0,__n);
    }
  }
  uVar16 = 0;
  memset((cpi->common).above_contexts.partition[iVar15] + iVar3,0,uVar18);
  memset((cpi->common).above_contexts.txfm[iVar15] + iVar3,0x40,uVar18);
  iVar15 = tile->tile_row;
  do {
    (td->mb).e_mbd.above_entropy_context[uVar16] =
         (cpi->common).above_contexts.entropy[uVar16][iVar15];
    uVar16 = uVar16 + 1;
  } while (num_planes != uVar16);
  (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[iVar15];
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[iVar15];
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) &&
     ((td->mb).e_mbd.current_base_qindex = (cpi->common).quant_params.base_qindex,
     (cpi->common).delta_q_info.delta_lf_present_flag != 0)) {
    av1_reset_loop_filter_delta(&(td->mb).e_mbd,num_planes);
  }
  if ((int)mi_row_00 < iVar5) {
    papTVar1 = (cpi->token_info).tplist;
    pMVar10 = &td->mb;
    do {
      bVar9 = (byte)((cpi->common).seq_params)->mib_size_log2 & 0x1f;
      if (((cpi->token_info).tile_tok[0][0] == (TokenExtra *)0x0) ||
         ((*papTVar1)[0] == (TokenList *)0x0)) {
        local_38 = (TokenExtra *)(ulong)(uint)(0 >> bVar9);
      }
      else {
        local_38 = (cpi->token_info).tplist[tile_row][tile_col]
                   [(int)(mi_row_00 - tile->mi_row_start) >> bVar9].start;
      }
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x17) = '\0';
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0x1f) = '\0';
      pMVar12 = &(td->mb).e_mbd;
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 2) + 7) = '\0';
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 2) + 0xf) = '\0';
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x17) = '\0';
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0x1f) = '\0';
      pMVar12 = &(td->mb).e_mbd;
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 1) + 7) = '\0';
      paEVar13 = (td->mb).e_mbd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar13 + 1) + 0xf) = '\0';
      pMVar12 = &(td->mb).e_mbd;
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x17) = '\0';
      pMVar12 = &(td->mb).e_mbd;
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0x1f) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pMVar10->e_mbd).left_entropy_context + 0) + 7) = '\0';
      pMVar12 = &(td->mb).e_mbd;
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar12->left_entropy_context + 0) + 0xf) = '\0';
      pMVar11 = &td->mb;
      (pMVar11->e_mbd).left_partition_context[0x10] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x11] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x12] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x13] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x14] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x15] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x16] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x17] = '\0';
      pMVar11 = &td->mb;
      (pMVar11->e_mbd).left_partition_context[0x18] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x19] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1a] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1b] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1c] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1d] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1e] = '\0';
      (pMVar11->e_mbd).left_partition_context[0x1f] = '\0';
      (td->mb).e_mbd.left_partition_context[0] = '\0';
      (td->mb).e_mbd.left_partition_context[1] = '\0';
      (td->mb).e_mbd.left_partition_context[2] = '\0';
      (td->mb).e_mbd.left_partition_context[3] = '\0';
      (td->mb).e_mbd.left_partition_context[4] = '\0';
      (td->mb).e_mbd.left_partition_context[5] = '\0';
      (td->mb).e_mbd.left_partition_context[6] = '\0';
      (td->mb).e_mbd.left_partition_context[7] = '\0';
      pMVar11 = &td->mb;
      (pMVar11->e_mbd).left_partition_context[8] = '\0';
      (pMVar11->e_mbd).left_partition_context[9] = '\0';
      (pMVar11->e_mbd).left_partition_context[10] = '\0';
      (pMVar11->e_mbd).left_partition_context[0xb] = '\0';
      (pMVar11->e_mbd).left_partition_context[0xc] = '\0';
      (pMVar11->e_mbd).left_partition_context[0xd] = '\0';
      (pMVar11->e_mbd).left_partition_context[0xe] = '\0';
      (pMVar11->e_mbd).left_partition_context[0xf] = '\0';
      builtin_memcpy((td->mb).e_mbd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20
                    );
      for (iVar15 = iVar3; iVar15 < iVar4; iVar15 = iVar15 + ((cpi->common).seq_params)->mib_size) {
        pCVar14 = av1_get_cb_coeff_buffer(cpi,mi_row_00,iVar15);
        (td->mb).cb_coef_buff = pCVar14;
        write_modes_sb(cpi,td,tile,w,&local_38,(TokenExtra *)(ulong)mi_row_00,iVar15,
                       (uint)((cpi->common).seq_params)->sb_size,(BLOCK_SIZE)papTVar1);
      }
      mi_row_00 = mi_row_00 + ((cpi->common).seq_params)->mib_size;
    } while ((int)mi_row_00 < iVar5);
  }
  return;
}

Assistant:

static inline void write_modes(AV1_COMP *const cpi, ThreadData *const td,
                               const TileInfo *const tile, aom_writer *const w,
                               int tile_row, int tile_col) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  const int mi_row_start = tile->mi_row_start;
  const int mi_row_end = tile->mi_row_end;
  const int mi_col_start = tile->mi_col_start;
  const int mi_col_end = tile->mi_col_end;
  const int num_planes = av1_num_planes(cm);

  av1_zero_above_context(cm, xd, mi_col_start, mi_col_end, tile->tile_row);
  av1_init_above_context(&cm->above_contexts, num_planes, tile->tile_row, xd);

  if (cpi->common.delta_q_info.delta_q_present_flag) {
    xd->current_base_qindex = cpi->common.quant_params.base_qindex;
    if (cpi->common.delta_q_info.delta_lf_present_flag) {
      av1_reset_loop_filter_delta(xd, num_planes);
    }
  }

  for (int mi_row = mi_row_start; mi_row < mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    const int sb_row_in_tile =
        (mi_row - tile->mi_row_start) >> cm->seq_params->mib_size_log2;
    const TokenInfo *token_info = &cpi->token_info;
    const TokenExtra *tok;
    const TokenExtra *tok_end;
    get_token_pointers(token_info, tile_row, tile_col, sb_row_in_tile, &tok,
                       &tok_end);

    av1_zero_left_context(xd);

    for (int mi_col = mi_col_start; mi_col < mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      td->mb.cb_coef_buff = av1_get_cb_coeff_buffer(cpi, mi_row, mi_col);
      write_modes_sb(cpi, td, tile, w, &tok, tok_end, mi_row, mi_col,
                     cm->seq_params->sb_size);
    }
    assert(tok == tok_end);
  }
}